

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDirWrapper.cpp
# Opt level: O2

QString * __thiscall
DebugDirEntryWrapper::translateType
          (QString *__return_storage_ptr__,DebugDirEntryWrapper *this,int type)

{
  char *ch;
  
  if ((uint)type < 0x11) {
    ch = &DAT_00135b54 + *(int *)(&DAT_00135b54 + (ulong)(uint)type * 4);
  }
  else {
    ch = "<Unknown>";
  }
  QString::QString(__return_storage_ptr__,ch);
  return __return_storage_ptr__;
}

Assistant:

QString DebugDirEntryWrapper::translateType(int type)
{
    switch (type) {
        case pe::DT_UNKNOWN : return "unknown";
        case pe::DT_COFF : return "COFF";
        case pe::DT_CODEVIEW : return "Visual C++ (CodeView)";
        case pe::DT_FPO : return "Frame pointer omission";
        case pe::DT_MISC : return "DBG file";
        case pe::DT_EXCEPTION : return "A copy of .pdata section";
        case pe::DT_FIXUP : return "Reserved";
        case pe::DT_OMAP_TO_SRC : return "mapping from an RVA in image to an RVA in source image";
        case pe::DT_OMAP_FROM_SRC : return "mapping from an RVA in source image to an RVA in image";
        case pe::DT_BORLAND : return "Borland";
        case pe::DT_RESERVED10 : return "Reserved";
        case pe::DT_CLSID : return "CLSID";
        case pe::DT_VC_FEATURE : return "VC Feature";
        case pe::DT_POGO : return "POGO";
        case pe::DT_ILTCG : return "ILTCG";
        case pe::DT_MPX : return "MPX";
        case pe::DT_REPRO : return "REPRO";
    }
    return "<Unknown>";
}